

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_line_c4(uchar *pixels,int w,int h,int stride,int x0,int y0,int x1,int y1,uint color,
                       int thickness)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int x;
  int iVar7;
  long lVar8;
  float t;
  
  t = (float)thickness * 0.5;
  iVar3 = x1;
  iVar1 = x0;
  if (x1 < x0) {
    iVar3 = x0;
    iVar1 = x1;
  }
  iVar5 = y1;
  iVar7 = y0;
  if (y1 < y0) {
    iVar5 = y0;
    iVar7 = y1;
  }
  lVar8 = (long)(int)((float)iVar7 - t);
  do {
    if ((float)iVar5 + t <= (float)(int)lVar8) {
      return;
    }
    if (-1 < lVar8) {
      if (h <= lVar8) {
        return;
      }
      lVar6 = lVar8 * stride;
      uVar4 = (int)((float)iVar1 - t) * 4;
      for (iVar7 = (int)((float)iVar1 - t); (float)iVar7 < (float)iVar3 + t; iVar7 = iVar7 + 1) {
        if (-1 < iVar7) {
          if (w <= iVar7) break;
          bVar2 = distance_lessthan(iVar7,(int)lVar8,x0,y0,x1,y1,t);
          if (bVar2) {
            pixels[(ulong)uVar4 + lVar6] = (uchar)color;
            pixels[(ulong)(uVar4 + 1) + lVar6] = (uchar)(color >> 8);
            pixels[(ulong)(uVar4 + 2) + lVar6] = (uchar)(color >> 0x10);
            pixels[(ulong)(uVar4 + 3) + lVar6] = (uchar)(color >> 0x18);
          }
        }
        uVar4 = uVar4 + 4;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void draw_line_c4(unsigned char* pixels, int w, int h, int stride, int x0, int y0, int x1, int y1, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    const float t0 = thickness / 2.f;
    const float t1 = thickness - t0;

    int x_min = std::min(x0, x1);
    int x_max = std::max(x0, x1);
    int y_min = std::min(y0, y1);
    int y_max = std::max(y0, y1);

    for (int y = y_min - t0; y < y_max + t1; y++)
    {
        if (y < 0)
            continue;

        if (y >= h)
            break;

        unsigned char* p = pixels + stride * y;

        for (int x = x_min - t0; x < x_max + t1; x++)
        {
            if (x < 0)
                continue;

            if (x >= w)
                break;

            // distance from line
            if (distance_lessthan(x, y, x0, y0, x1, y1, t1))
            {
                p[x * 4 + 0] = pen_color[0];
                p[x * 4 + 1] = pen_color[1];
                p[x * 4 + 2] = pen_color[2];
                p[x * 4 + 3] = pen_color[3];
            }
        }
    }
}